

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qline.cpp
# Opt level: O1

QDebug operator<<(QDebug dbg,QLine *p)

{
  QPoint QVar1;
  storage_type *in_RCX;
  undefined8 *in_RDX;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QDebugStateSaver saver;
  QPoint local_68;
  QPoint local_60;
  QPoint local_58;
  QDebug local_50;
  QDebugStateSaver local_48;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_48,(QDebug *)p);
  QVar1 = p->pt1;
  *(undefined1 *)&((QTextStream *)((long)QVar1 + 0x30))->_vptr_QTextStream = 0;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"QLine(";
  QString::fromUtf8(&local_40,(QString *)0x6,ba);
  QTextStream::operator<<((QTextStream *)QVar1,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(char *)&((QTextStream *)((long)p->pt1 + 0x30))->_vptr_QTextStream == '\x01') {
    QTextStream::operator<<((QTextStream *)p->pt1,' ');
  }
  local_68 = p->pt1;
  *(int *)((long)local_68 + 0x28) = *(int *)((long)local_68 + 0x28) + 1;
  local_40.d.d = (Data *)*in_RDX;
  operator<<((Stream *)&local_60,&local_68);
  QTextStream::operator<<((QTextStream *)local_60,',');
  if (*(char *)&((QTextStream *)((long)local_60 + 0x30))->_vptr_QTextStream == '\x01') {
    QTextStream::operator<<((QTextStream *)local_60,' ');
  }
  local_58 = local_60;
  *(int *)&(((unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_> *)
            ((long)local_60 + 0x28))->_M_t).
           super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
           super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
           super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl =
       *(int *)&(((unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_> *)
                 ((long)local_60 + 0x28))->_M_t).
                super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>.
                _M_t.
                super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>
                .super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl + 1;
  operator<<((Stream *)&local_50,&local_58);
  QTextStream::operator<<(&(local_50.stream)->ts,')');
  if ((local_50.stream)->space == true) {
    QTextStream::operator<<(&(local_50.stream)->ts,' ');
  }
  QDebug::~QDebug(&local_50);
  QDebug::~QDebug((QDebug *)&local_58);
  QDebug::~QDebug((QDebug *)&local_60);
  QDebug::~QDebug((QDebug *)&local_68);
  QVar1 = p->pt1;
  (p->pt1).xp = 0;
  (p->pt1).yp = 0;
  ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)QVar1;
  QDebugStateSaver::~QDebugStateSaver(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QLine &p)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QLine(" << p.p1() << ',' << p.p2() << ')';
    return dbg;
}